

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

void Abc_FrameMiniAigSetCiArrivals(Abc_Frame_t *pAbc,int *pArrivals)

{
  Gia_Man_t *pGVar1;
  Vec_Int_t *pVVar2;
  char *__s;
  
  if (pArrivals == (int *)0x0) {
    __s = "Arrival times are not given.";
  }
  else if (pAbc == (Abc_Frame_t *)0x0) {
    __s = "ABC framework is not initialized by calling Abc_Start().";
  }
  else {
    pGVar1 = Abc_FrameReadGia(pAbc);
    if (pGVar1 != (Gia_Man_t *)0x0) {
      Vec_IntFreeP(&pGVar1->vCiArrs);
      pVVar2 = Vec_IntAllocArrayCopy(pArrivals,pGVar1->vCis->nSize);
      pGVar1->vCiArrs = pVVar2;
      return;
    }
    __s = "Current network in ABC framework is not defined.";
  }
  puts(__s);
  return;
}

Assistant:

void Abc_FrameMiniAigSetCiArrivals( Abc_Frame_t * pAbc, int * pArrivals )
{
    Gia_Man_t * pGia;
    if ( pArrivals == NULL )
        { printf( "Arrival times are not given.\n" ); return; }
    if ( pAbc == NULL )
        { printf( "ABC framework is not initialized by calling Abc_Start().\n" ); return; }
    pGia = Abc_FrameReadGia( pAbc );
    if ( pGia == NULL )
        { printf( "Current network in ABC framework is not defined.\n" ); return; }
    Vec_IntFreeP( &pGia->vCiArrs );
    pGia->vCiArrs = Vec_IntAllocArrayCopy( pArrivals, Gia_ManCiNum(pGia) );
}